

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplaceRealloc<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos,
          Expression *args,Expression **args_1,EdgeKind *args_2,
          span<std::array<char,_2UL>,_18446744073709551615UL> *args_3)

{
  undefined8 *puVar1;
  EdgeKind EVar2;
  ulong uVar3;
  Expression *pEVar4;
  pointer p;
  pointer paVar5;
  size_t sVar6;
  Expression *pEVar7;
  pointer paVar8;
  undefined4 uVar9;
  pointer pAVar10;
  long lVar11;
  pointer pAVar12;
  pointer pAVar13;
  long lVar14;
  size_type sVar15;
  ulong uVar16;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar3 = this->cap;
  if (uVar16 < uVar3 * 2) {
    uVar16 = uVar3 * 2;
  }
  if (0x333333333333333 - uVar3 < uVar3) {
    uVar16 = 0x333333333333333;
  }
  lVar14 = (long)pos - (long)this->data_;
  pAVar10 = (pointer)operator_new(uVar16 * 0x28);
  pEVar4 = *args_1;
  EVar2 = *args_2;
  paVar5 = args_3->_M_ptr;
  sVar6 = (args_3->_M_extent)._M_extent_value;
  *(Expression **)((long)pAVar10 + lVar14) = args;
  *(Expression **)((long)pAVar10 + lVar14 + 8) = pEVar4;
  *(EdgeKind *)((long)pAVar10 + lVar14 + 0x10) = EVar2;
  puVar1 = (undefined8 *)((long)pAVar10 + lVar14 + 0x18);
  *puVar1 = paVar5;
  puVar1[1] = sVar6;
  p = this->data_;
  sVar15 = this->len;
  lVar11 = (long)p + (sVar15 * 0x28 - (long)pos);
  pAVar12 = p;
  pAVar13 = pAVar10;
  if (lVar11 == 0) {
    pAVar12 = pAVar10;
    pAVar13 = p;
    if (sVar15 != 0) {
      do {
        (pAVar12->edgeDescriptors)._M_extent._M_extent_value =
             (pAVar13->edgeDescriptors)._M_extent._M_extent_value;
        pEVar4 = pAVar13->expr;
        pEVar7 = pAVar13->condition;
        uVar9 = *(undefined4 *)&pAVar13->field_0x14;
        paVar8 = (pAVar13->edgeDescriptors)._M_ptr;
        pAVar12->edge = pAVar13->edge;
        *(undefined4 *)&pAVar12->field_0x14 = uVar9;
        (pAVar12->edgeDescriptors)._M_ptr = paVar8;
        pAVar12->expr = pEVar4;
        pAVar12->condition = pEVar7;
        pAVar13 = pAVar13 + 1;
        pAVar12 = pAVar12 + 1;
      } while (pAVar13 != pos);
    }
  }
  else {
    for (; pAVar12 != pos; pAVar12 = pAVar12 + 1) {
      (pAVar13->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar12->edgeDescriptors)._M_extent._M_extent_value;
      pEVar4 = pAVar12->expr;
      pEVar7 = pAVar12->condition;
      uVar9 = *(undefined4 *)&pAVar12->field_0x14;
      paVar8 = (pAVar12->edgeDescriptors)._M_ptr;
      pAVar13->edge = pAVar12->edge;
      *(undefined4 *)&pAVar13->field_0x14 = uVar9;
      (pAVar13->edgeDescriptors)._M_ptr = paVar8;
      pAVar13->expr = pEVar4;
      pAVar13->condition = pEVar7;
      pAVar13 = pAVar13 + 1;
    }
    memcpy((void *)((long)pAVar10 + lVar14 + 0x28),pos,((lVar11 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar15 = this->len;
  }
  this->len = sVar15 + 1;
  this->cap = uVar16;
  this->data_ = pAVar10;
  return (pointer)((long)pAVar10 + lVar14);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}